

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * CreateNewWindow(char *name,ImGuiWindowFlags flags)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiWindow *window_00;
  ImGuiViewport *pIVar3;
  ImGuiWindowSettings *p;
  uint in_ESI;
  ImGuiContext *in_RDI;
  ImVec2 IVar4;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindowSettings *settings;
  ImGuiViewport *main_viewport;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  size_t in_stack_ffffffffffffff80;
  ImVector<ImGuiWindow_*> *this;
  ImVec2 *this_00;
  undefined8 in_stack_ffffffffffffffa8;
  ImGuiID IVar5;
  ImVec2 in_stack_ffffffffffffffb0;
  undefined4 in_stack_fffffffffffffff0;
  
  pIVar1 = GImGui;
  IVar5 = (ImGuiID)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  ImGui::MemAlloc(in_stack_ffffffffffffff80);
  window_00 = (ImGuiWindow *)operator_new(1000);
  ImGuiWindow::ImGuiWindow(unaff_retaddr,in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  window_00->Flags = in_ESI;
  ImGuiStorage::SetVoidPtr((ImGuiStorage *)in_stack_ffffffffffffffb0,IVar5,window_00);
  pIVar3 = ImGui::GetMainViewport();
  this = (ImVector<ImGuiWindow_*> *)&pIVar3->Pos;
  this_00 = (ImVec2 *)&stack0xffffffffffffffb0;
  ImVec2::ImVec2(this_00,60.0,60.0);
  IVar5 = (ImGuiID)((ulong)this_00 >> 0x20);
  IVar4 = operator+((ImVec2 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                    (ImVec2 *)0x15ec35);
  window_00->Pos = IVar4;
  if (((in_ESI & 0x100) == 0) &&
     (p = ImGui::FindWindowSettings(IVar5), p != (ImGuiWindowSettings *)0x0)) {
    iVar2 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(&pIVar1->SettingsWindows,p);
    window_00->SettingsOffset = iVar2;
    SetWindowConditionAllowFlags(window_00,4,false);
    ApplyWindowSettings((ImGuiWindow *)in_stack_ffffffffffffffb0,p);
  }
  (window_00->DC).CursorMaxPos = window_00->Pos;
  (window_00->DC).CursorStartPos = (window_00->DC).CursorMaxPos;
  if ((in_ESI & 0x40) == 0) {
    if ((window_00->Size).x <= 0.0) {
      window_00->AutoFitFramesX = '\x02';
    }
    if ((window_00->Size).y <= 0.0) {
      window_00->AutoFitFramesY = '\x02';
    }
    in_stack_ffffffffffffff7f = true;
    if (window_00->AutoFitFramesX < '\x01') {
      in_stack_ffffffffffffff7f = '\0' < window_00->AutoFitFramesY;
    }
    window_00->AutoFitOnlyGrows = (bool)in_stack_ffffffffffffff7f;
  }
  else {
    window_00->AutoFitFramesY = '\x02';
    window_00->AutoFitFramesX = '\x02';
    window_00->AutoFitOnlyGrows = false;
  }
  ImVector<ImGuiWindow_*>::push_back
            (this,(ImGuiWindow **)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if ((in_ESI & 0x2000) == 0) {
    ImVector<ImGuiWindow_*>::push_back
              (this,(ImGuiWindow **)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  }
  else {
    ImVector<ImGuiWindow_*>::push_front
              (this,(ImGuiWindow **)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  }
  return window_00;
}

Assistant:

static ImGuiWindow* CreateNewWindow(const char* name, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    //IMGUI_DEBUG_LOG("CreateNewWindow '%s', flags = 0x%08X\n", name, flags);

    // Create window the first time
    ImGuiWindow* window = IM_NEW(ImGuiWindow)(&g, name);
    window->Flags = flags;
    g.WindowsById.SetVoidPtr(window->ID, window);

    // Default/arbitrary window position. Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    window->Pos = main_viewport->Pos + ImVec2(60, 60);

    // User can disable loading and saving of settings. Tooltip and child windows also don't store settings.
    if (!(flags & ImGuiWindowFlags_NoSavedSettings))
        if (ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID))
        {
            // Retrieve settings from .ini file
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
            SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
            ApplyWindowSettings(window, settings);
        }
    window->DC.CursorStartPos = window->DC.CursorMaxPos = window->Pos; // So first call to CalcContentSize() doesn't return crazy values

    if ((flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }

    g.WindowsFocusOrder.push_back(window);
    if (flags & ImGuiWindowFlags_NoBringToFrontOnFocus)
        g.Windows.push_front(window); // Quite slow but rare and only once
    else
        g.Windows.push_back(window);
    return window;
}